

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtBarrelShape.cpp
# Opt level: O3

void __thiscall
cbtBarrelShape::calculateLocalInertia(cbtBarrelShape *this,cbtScalar mass,cbtVector3 *inertia)

{
  undefined8 uVar1;
  float fVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  float fVar6;
  float fVar8;
  float fVar9;
  float fVar10;
  undefined1 auVar7 [16];
  
  fVar2 = mass * 0.08333333;
  auVar4 = vinsertps_avx(ZEXT416((uint)this->R_vert),ZEXT416((uint)(this->R_hor + this->R_offset)),
                         0x10);
  auVar3._8_4_ = 0x3d23d70a;
  auVar3._0_8_ = 0x3d23d70a3d23d70a;
  auVar3._12_4_ = 0x3d23d70a;
  auVar4 = vaddps_avx512vl(auVar4,auVar3);
  fVar6 = auVar4._0_4_ + auVar4._0_4_;
  fVar8 = auVar4._4_4_ + auVar4._4_4_;
  fVar9 = auVar4._8_4_ + auVar4._8_4_;
  fVar10 = auVar4._12_4_ + auVar4._12_4_;
  auVar7._0_4_ = fVar6 * fVar6;
  auVar7._4_4_ = fVar8 * fVar8;
  auVar7._8_4_ = fVar9 * fVar9;
  auVar7._12_4_ = fVar10 * fVar10;
  auVar4 = vmovshdup_avx(auVar7);
  auVar5._0_4_ = fVar2 * (auVar4._0_4_ + auVar7._0_4_);
  auVar5._4_4_ = fVar2 * (auVar4._4_4_ + auVar7._4_4_);
  auVar5._8_4_ = fVar2 * (auVar4._8_4_ + auVar7._8_4_);
  auVar5._12_4_ = fVar2 * (auVar4._12_4_ + auVar7._12_4_);
  uVar1 = vmovlps_avx(auVar5);
  *(undefined8 *)inertia->m_floats = uVar1;
  inertia->m_floats[2] = auVar5._0_4_;
  return;
}

Assistant:

void	cbtBarrelShape::calculateLocalInertia(cbtScalar mass,cbtVector3& inertia) const
{
	//***TO DO***
	//as an approximation, take the inertia of the box that bounds the barrell

	cbtTransform ident;
	ident.setIdentity();

	cbtVector3 halfExtents;

	halfExtents.setValue((R_hor+R_offset), 
						 (R_vert),
						 (R_hor+R_offset));

	cbtScalar margin = CONVEX_DISTANCE_MARGIN;

	cbtScalar lx=cbtScalar(2.)*(halfExtents[0]+margin);
	cbtScalar ly=cbtScalar(2.)*(halfExtents[1]+margin);
	cbtScalar lz=cbtScalar(2.)*(halfExtents[2]+margin);
	const cbtScalar x2 = lx*lx;
	const cbtScalar y2 = ly*ly;
	const cbtScalar z2 = lz*lz;
	const cbtScalar scaledmass = mass * cbtScalar(.08333333);

	inertia[0] = scaledmass * (y2+z2);
	inertia[1] = scaledmass * (x2+z2);
	inertia[2] = scaledmass * (x2+y2);
}